

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort.c
# Opt level: O0

saidx64_t divbwt64(sauchar_t *T,sauchar_t *U,saidx64_t *A,saidx64_t n)

{
  saidx64_t *bucket_A_00;
  saidx64_t *bucket_B_00;
  saidx64_t sVar1;
  long in_RCX;
  saidx64_t *in_RDX;
  sauchar_t *in_RSI;
  sauchar_t *in_RDI;
  saidx64_t i;
  saidx64_t pidx;
  saidx64_t m;
  saidx64_t *bucket_B;
  saidx64_t *bucket_A;
  saidx64_t *B;
  long local_58;
  long local_50;
  saidx64_t *local_30;
  long local_8;
  
  if (((in_RDI == (sauchar_t *)0x0) || (in_RSI == (sauchar_t *)0x0)) || (in_RCX < 0)) {
    local_8 = -1;
  }
  else if (in_RCX < 2) {
    local_8 = in_RCX;
    if (in_RCX == 1) {
      *in_RSI = *in_RDI;
    }
  }
  else {
    local_30 = in_RDX;
    if (in_RDX == (saidx64_t *)0x0) {
      local_30 = (saidx64_t *)malloc((in_RCX + 1) * 8);
    }
    bucket_A_00 = (saidx64_t *)malloc(0x800);
    bucket_B_00 = (saidx64_t *)malloc(0x80000);
    if (((local_30 == (saidx64_t *)0x0) || (bucket_A_00 == (saidx64_t *)0x0)) ||
       (bucket_B_00 == (saidx64_t *)0x0)) {
      local_50 = -2;
    }
    else {
      sVar1 = sort_typeBstar(U,A,(saidx64_t *)n,B,(saidx64_t)bucket_A);
      sVar1 = construct_BWT(in_RDI,local_30,bucket_A_00,bucket_B_00,in_RCX,sVar1);
      *in_RSI = in_RDI[in_RCX + -1];
      for (local_58 = 0; local_58 < sVar1; local_58 = local_58 + 1) {
        in_RSI[local_58 + 1] = (sauchar_t)local_30[local_58];
      }
      while (local_58 = local_58 + 1, local_58 < in_RCX) {
        in_RSI[local_58] = (sauchar_t)local_30[local_58];
      }
      local_50 = sVar1 + 1;
    }
    free(bucket_B_00);
    free(bucket_A_00);
    if (in_RDX == (saidx64_t *)0x0) {
      free(local_30);
    }
    local_8 = local_50;
  }
  return local_8;
}

Assistant:

saidx_t
divbwt(const sauchar_t *T, sauchar_t *U, saidx_t *A, saidx_t n) {
  saidx_t *B;
  saidx_t *bucket_A, *bucket_B;
  saidx_t m, pidx, i;

  /* Check arguments. */
  if((T == NULL) || (U == NULL) || (n < 0)) { return -1; }
  else if(n <= 1) { if(n == 1) { U[0] = T[0]; } return n; }

  if((B = A) == NULL) { B = (saidx_t *)malloc((size_t)(n + 1) * sizeof(saidx_t)); }
  bucket_A = (saidx_t *)malloc(BUCKET_A_SIZE * sizeof(saidx_t));
  bucket_B = (saidx_t *)malloc(BUCKET_B_SIZE * sizeof(saidx_t));

  /* Burrows-Wheeler Transform. */
  if((B != NULL) && (bucket_A != NULL) && (bucket_B != NULL)) {
    m = sort_typeBstar(T, B, bucket_A, bucket_B, n);
    pidx = construct_BWT(T, B, bucket_A, bucket_B, n, m);

    /* Copy to output string. */
    U[0] = T[n - 1];
    for(i = 0; i < pidx; ++i) { U[i + 1] = (sauchar_t)B[i]; }
    for(i += 1; i < n; ++i) { U[i] = (sauchar_t)B[i]; }
    pidx += 1;
  } else {
    pidx = -2;
  }

  free(bucket_B);
  free(bucket_A);
  if(A == NULL) { free(B); }

  return pidx;
}